

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_mvl.c
# Opt level: O0

int mvlLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  void *pvVar2;
  char local_41 [8];
  char name [13];
  PHYSFS_uint32 size;
  PHYSFS_uint32 i;
  PHYSFS_uint32 pos;
  void *arc_local;
  PHYSFS_uint32 count_local;
  PHYSFS_Io *io_local;
  
  size = count * 0x11 + 8;
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  while( true ) {
    if (count <= (uint)name._9_4_) {
      return 1;
    }
    iVar1 = __PHYSFS_readAll(io,local_41,0xd);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,name + 5,4);
    if (iVar1 == 0) {
      return 0;
    }
    name[4] = '\0';
    name._5_4_ = PHYSFS_swapULE32(name._5_4_);
    pvVar2 = UNPK_addEntry(arc,local_41,0,-1,-1,(ulong)size,(ulong)(uint)name._5_4_);
    if (pvVar2 == (void *)0x0) break;
    size = name._5_4_ + size;
    name._9_4_ = name._9_4_ + 1;
  }
  return 0;
}

Assistant:

static int mvlLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 pos = 8 + (17 * count);   /* past sig+metadata. */
    PHYSFS_uint32 i;

    for (i = 0; i < count; i++)
    {
        PHYSFS_uint32 size;
        char name[13];
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 13), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        name[12] = '\0';  /* just in case. */
        size = PHYSFS_swapULE32(size);
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
        pos += size;
    } /* for */

    return 1;
}